

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O1

bool __thiscall
YAML::EmitterState::SetBoolFormat(EmitterState *this,EMITTER_MANIP value,value scope)

{
  if (value - YesNoBool < 3) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_boolFmt,value,scope);
  }
  return value - YesNoBool < 3;
}

Assistant:

bool EmitterState::SetBoolFormat(EMITTER_MANIP value, FmtScope::value scope) {
  switch (value) {
    case OnOffBool:
    case TrueFalseBool:
    case YesNoBool:
      _Set(m_boolFmt, value, scope);
      return true;
    default:
      return false;
  }
}